

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O2

void receive_gui_job(void)

{
  char *__s2;
  char cVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  char *__buf;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  bool key_pressed [2];
  char match_buffer [20];
  char buffer [100000];
  
  key_pressed[0] = false;
  key_pressed[1] = false;
  match_buffer[0] = '\0';
  match_buffer[1] = '\0';
  match_buffer[2] = '\0';
  match_buffer[3] = '\0';
  match_buffer[4] = '\0';
  match_buffer[5] = '\0';
  match_buffer[6] = '\0';
  match_buffer[7] = '\0';
  match_buffer[8] = '\0';
  match_buffer[9] = '\0';
  match_buffer[10] = '\0';
  match_buffer[0xb] = '\0';
  match_buffer[0xc] = '\0';
  match_buffer[0xd] = '\0';
  match_buffer[0xe] = '\0';
  match_buffer[0xf] = '\0';
  match_buffer[0x10] = '\0';
  match_buffer[0x11] = '\0';
  match_buffer[0x12] = '\0';
  match_buffer[0x13] = '\0';
  uVar6 = 0;
  do {
    __buf = buffer;
    sVar3 = recv(servers[1].socket,__buf,100000,0);
    if (sVar3 == 0) {
      piVar4 = __errno_location();
      if (*piVar4 != 0) {
        perror("Connection to GUI failed");
        exit(1);
      }
    }
    for (; __buf < buffer + sVar3; __buf = __buf + 1) {
      cVar1 = *__buf;
      if (uVar6 < 0x14 && cVar1 != '\n') {
        match_buffer[uVar6] = cVar1;
        uVar6 = uVar6 + 1;
      }
      if ((cVar1 == '\n') && (uVar6 - 0xb < 5)) {
        piVar4 = &DAT_0010c9e8;
        for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
          __s2 = *(char **)(piVar4 + -2);
          iVar2 = strncmp(match_buffer,__s2,(long)*piVar4);
          if (iVar2 == 0) {
            fprintf(_stderr,"GUI recv: %s\n",__s2);
            key_pressed[uVar5 >> 1] = (bool)((byte)uVar5 & 1);
          }
          piVar4 = piVar4 + 4;
        }
        cVar1 = *__buf;
      }
      if (cVar1 == '\n') {
        match_buffer[0] = '\0';
        match_buffer[1] = '\0';
        match_buffer[2] = '\0';
        match_buffer[3] = '\0';
        match_buffer[4] = '\0';
        match_buffer[5] = '\0';
        match_buffer[6] = '\0';
        match_buffer[7] = '\0';
        match_buffer[8] = '\0';
        match_buffer[9] = '\0';
        match_buffer[10] = '\0';
        match_buffer[0xb] = '\0';
        match_buffer[0xc] = '\0';
        match_buffer[0xd] = '\0';
        match_buffer[0xe] = '\0';
        match_buffer[0xf] = '\0';
        match_buffer[0x10] = '\0';
        match_buffer[0x11] = '\0';
        match_buffer[0x12] = '\0';
        match_buffer[0x13] = '\0';
        uVar6 = 0;
      }
    }
    turn_direction = key_pressed[0] - key_pressed[1];
  } while( true );
}

Assistant:

void receive_gui_job()
{
	bool key_pressed[2] = { false, false };
	
	constexpr std::pair<const char*, int> messages[] = {
		std::make_pair("LEFT_KEY_UP", sizeof("LEFT_KEY_UP")),
		std::make_pair("LEFT_KEY_DOWN", sizeof("LEFT_KEY_DOWN")),
		std::make_pair("RIGHT_KEY_UP", sizeof("RIGHT_KEY_UP")),
		std::make_pair("RIGHT_KEY_DOWN", sizeof("RIGHT_KEY_DOWN"))
	};

	constexpr int BUFFER_SIZE = 100000;
	char buffer[BUFFER_SIZE];
	// Since proper messages are newline-separated and TCP operates on stream of data,
	// copy first 16 signs and match the message
	char match_buffer[20] = { 0 };
	size_t msg_len = 0;

	while (true)
	{
		ssize_t read_len = recv(gui_server.socket, buffer, BUFFER_SIZE, 0);
		if (read_len == 0 && errno != 0)
		{
			std::perror("Connection to GUI failed");
			std::exit(1); // TODO: Verify that client exits
		}

		const char* pointer = buffer;
		while (pointer < buffer + read_len)
		{
			if (*pointer != '\n' && msg_len < sizeof(match_buffer))
			{
				match_buffer[msg_len] = *pointer;
				msg_len++;
			}
			// End of message and current message length in valid range (to avoid needless checks), check for message
			if (*pointer == '\n' && msg_len >= sizeof("LEFT_KEY_UP") - 1 && msg_len <= sizeof("RIGHT_KEY_DOWN"))
			{
				for (size_t i = 0; i < sizeof(messages) / sizeof(messages[0]); ++i)
				{
					// Directly map messages to the keys and values (pair of LEFT/RIGHT and UP/DOWN)
					if (strncmp(match_buffer, messages[i].first, messages[i].second) == 0)
					{
						fprintf(stderr, "GUI recv: %s\n", messages[i].first);
						key_pressed[i / 2] = (i % 2);
					}
				}
			}
			// Reset matching buffer, since every valid message is separated by newlines
			if (*pointer == '\n')
			{
				memset(match_buffer, 0x00, sizeof(match_buffer));
				msg_len = 0;
			}
			pointer++;
		}
		// Update turn direction after change
		turn_direction = (1 * key_pressed[0]) + (-1 * key_pressed[1]);
	}
}